

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

Fl_Plugin * __thiscall Fl_Plugin_Manager::plugin(Fl_Plugin_Manager *this,char *name)

{
  char cVar1;
  Fl_Plugin *pFVar2;
  Fl_Preferences pin;
  char buf [34];
  
  cVar1 = Fl_Preferences::groupExists(&this->super_Fl_Preferences,name);
  if (cVar1 == '\0') {
    pFVar2 = (Fl_Plugin *)0x0;
  }
  else {
    Fl_Preferences::Fl_Preferences(&pin,&this->super_Fl_Preferences,name);
    Fl_Preferences::get(&pin,"address",buf,"",0x22);
    if (buf[0] == '@') {
      pFVar2 = (Fl_Plugin *)a2p(buf + 1);
    }
    else {
      pFVar2 = (Fl_Plugin *)0x0;
    }
    ~Fl_Plugin_Manager((Fl_Plugin_Manager *)&pin);
  }
  return pFVar2;
}

Assistant:

Fl_Plugin *Fl_Plugin_Manager::plugin(const char *name) {
  char buf[34];
  Fl_Plugin *ret = 0;
  if (groupExists(name)) {
    Fl_Preferences pin(this, name);
    pin.get("address", buf, "", 34);
    if (buf[0]=='@') ret = (Fl_Plugin*)a2p(buf+1);
#ifdef FL_PLUGIN_VERBOSE
    printf("Fl_Plugin: returning plugin named \"%s\": (%s) %p\n", name, buf, ret);
#endif
    return ret;
  } else {
#ifdef FL_PLUGIN_VERBOSE
    printf("Fl_Plugin: no plugin found named \"%s\"\n", name);
#endif
    return 0L;
  }
}